

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

namespace_t __thiscall cs::instance_type::import(instance_type *this,string *path,string *name)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  undefined8 uVar4;
  string *str;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  domain_manager *in_RSI;
  element_type *in_RDI;
  namespace_t nVar5;
  context_t rt;
  string package_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  char *ch;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  string tmp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  collection;
  namespace_t *module;
  string *in_stack_fffffffffffff838;
  runtime_error *in_stack_fffffffffffff840;
  fatal_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff848;
  undefined7 in_stack_fffffffffffff850;
  byte in_stack_fffffffffffff857;
  compiler_type *in_stack_fffffffffffff858;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
  *in_stack_fffffffffffff860;
  allocator *paVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff868;
  undefined1 local_6f9 [57];
  string local_6c0 [32];
  undefined1 local_6a0 [48];
  instance_type *in_stack_fffffffffffff990;
  long local_668 [32];
  string *in_stack_fffffffffffffa98;
  instance_type *in_stack_fffffffffffffaa0;
  allocator local_431;
  string local_430 [38];
  undefined1 local_40a;
  allocator local_409;
  string local_408 [40];
  string *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc28;
  compiler_type *in_stack_fffffffffffffc30;
  string local_3a8 [64];
  string local_368 [32];
  string local_348 [48];
  string local_318 [32];
  long local_2f8 [14];
  context_t *in_stack_fffffffffffffd78;
  string local_e8 [32];
  string local_c8 [32];
  reference local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  undefined1 *local_90;
  reference local_78;
  undefined8 local_70;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined8 local_60;
  string local_58 [32];
  undefined1 local_38 [32];
  undefined8 local_18;
  
  local_18 = in_RDX;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1c50c7);
  std::__cxx11::string::string(local_58);
  local_60 = local_18;
  local_68._M_current = (char *)std::__cxx11::string::begin();
  local_70 = std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffff840,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffff838), bVar1) {
    local_78 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_68);
    if (*local_78 == ':') {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                  in_stack_fffffffffffff848);
      std::__cxx11::string::clear();
    }
    else {
      std::__cxx11::string::push_back((char)local_58);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_68);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
              in_stack_fffffffffffff848);
  std::__cxx11::string::~string(local_58);
  local_90 = local_38;
  local_98._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff838);
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff838);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff840,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff838);
    if (!bVar1) {
      str = (string *)__cxa_allocate_exception(0x28);
      this_00 = (fatal_error *)local_6f9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_6f9 + 1),"No such file or directory.",(allocator *)this_00);
      fatal_error::fatal_error(this_00,str);
      __cxa_throw(str,&fatal_error::typeinfo,fatal_error::~fatal_error);
    }
    local_a8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff858,in_stack_fffffffffffff857);
    std::operator+(in_stack_fffffffffffff848,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff840);
    std::__cxx11::string::~string(local_e8);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1c52ba);
    std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1c52c2);
    sVar2 = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
            ::count<std::__cxx11::string>
                      (in_stack_fffffffffffff860,
                       (key_arg<std::__cxx11::basic_string<char>_> *)in_stack_fffffffffffff858);
    if (sVar2 == 0) {
      std::operator+(in_stack_fffffffffffff868,(char *)in_stack_fffffffffffff860);
      std::ifstream::ifstream(local_2f8,local_318,_S_in);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)local_2f8 + *(long *)(local_2f8[0] + -0x18)));
      std::ifstream::~ifstream(local_2f8);
      std::__cxx11::string::~string(local_318);
      if (bVar1) {
        create_subcontext(in_stack_fffffffffffffd78);
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1c545a);
        std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1c5462);
        std::operator+(in_stack_fffffffffffff868,(char *)in_stack_fffffffffffff860);
        std::operator+(in_stack_fffffffffffff868,(char *)in_stack_fffffffffffff860);
        compiler_type::import_csym
                  (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
        std::__cxx11::string::~string(local_368);
        std::__cxx11::string::~string(local_348);
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1c54f1);
        std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1c54f9);
        std::shared_ptr<cs::context_type>::shared_ptr
                  ((shared_ptr<cs::context_type> *)in_stack_fffffffffffff840,
                   (shared_ptr<cs::context_type> *)in_stack_fffffffffffff838);
        compiler_type::swap_context
                  (in_stack_fffffffffffff858,
                   (context_t *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
        std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x1c5547);
        std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x1c5554);
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1c5561);
        std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1c556d);
        std::operator+(in_stack_fffffffffffff868,(char *)in_stack_fffffffffffff860);
        compile(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
        std::__cxx11::string::~string(local_3a8);
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1c57a1);
        std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1c57a9);
        std::shared_ptr<cs::context_type>::shared_ptr
                  ((shared_ptr<cs::context_type> *)in_stack_fffffffffffff840,
                   (shared_ptr<cs::context_type> *)in_stack_fffffffffffff838);
        compiler_type::swap_context
                  (in_stack_fffffffffffff858,
                   (context_t *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
        std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x1c57eb);
        std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x1c57f8);
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1c5805);
        std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1c5811);
        interpret(in_stack_fffffffffffff990);
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1c5828);
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) != 0) {
          local_40a = 1;
          uVar4 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_408,"Target file is not a package.",&local_409);
          runtime_error::runtime_error(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
          local_40a = 0;
          __cxa_throw(uVar4,&runtime_error::typeinfo,runtime_error::~runtime_error);
        }
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1c594d);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff840,in_stack_fffffffffffff838);
        if (bVar1) {
          uVar4 = __cxa_allocate_exception(0x28);
          paVar6 = &local_431;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_430,"Package name is different from file name.",paVar6)
          ;
          runtime_error::runtime_error(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
          __cxa_throw(uVar4,&runtime_error::typeinfo,runtime_error::~runtime_error);
        }
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1c5a5c);
        std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1c5a68);
        domain_manager::get_namespace(in_RSI);
        std::__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  in_stack_fffffffffffff840);
        std::make_shared<cs::name_space,cs::name_space&>((name_space *)in_stack_fffffffffffff868);
        std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x1c5aaa);
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1c5abe);
        std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1c5ac6);
        phmap::priv::
        raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
        ::
        emplace<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<cs::name_space>_&,_0>
                  ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                   in_stack_fffffffffffff848,(shared_ptr<cs::name_space> *)in_stack_fffffffffffff840
                  );
        bVar1 = true;
        std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x1c5b6b);
      }
      else {
        std::operator+(in_stack_fffffffffffff868,(char *)in_stack_fffffffffffff860);
        std::ifstream::ifstream(local_668,(string *)(local_6a0 + 0x18),_S_in);
        in_stack_fffffffffffff857 =
             std::ios::operator_cast_to_bool
                       ((ios *)((long)local_668 + *(long *)(local_668[0] + -0x18)));
        std::ifstream::~ifstream(local_668);
        std::__cxx11::string::~string((string *)(local_6a0 + 0x18));
        if ((in_stack_fffffffffffff857 & 1) == 0) {
          bVar1 = false;
        }
        else {
          local_6a0[0x17] = '\0';
          std::operator+(in_stack_fffffffffffff868,(char *)in_stack_fffffffffffff860);
          std::make_shared<cs::extension,std::__cxx11::string>(in_stack_fffffffffffff868);
          in_stack_fffffffffffff848 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6a0;
          std::shared_ptr<cs::name_space>::shared_ptr<cs::extension,void>
                    ((shared_ptr<cs::name_space> *)in_stack_fffffffffffff840,
                     (shared_ptr<cs::extension> *)in_stack_fffffffffffff838);
          std::shared_ptr<cs::extension>::~shared_ptr((shared_ptr<cs::extension> *)0x1c5c63);
          std::__cxx11::string::~string(local_6c0);
          std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1c5c84);
          std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1c5c8c);
          phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
          ::
          emplace<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<cs::name_space>_&,_0>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                     in_stack_fffffffffffff848,
                     (shared_ptr<cs::name_space> *)in_stack_fffffffffffff840);
          bVar1 = true;
          local_6a0[0x17] = '\x01';
        }
      }
    }
    else {
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1c5306);
      std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1c530e);
      phmap::priv::
      raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
      ::
      operator[]<std::__cxx11::string,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>>
                ((raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                 in_stack_fffffffffffff848);
      std::shared_ptr<cs::name_space>::shared_ptr
                ((shared_ptr<cs::name_space> *)in_stack_fffffffffffff840,
                 (shared_ptr<cs::name_space> *)in_stack_fffffffffffff838);
      bVar1 = true;
    }
    std::__cxx11::string::~string(local_c8);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
      nVar5.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      nVar5.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (namespace_t)nVar5.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>;
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_98);
  } while( true );
}

Assistant:

namespace_t instance_type::import(const std::string &path, const std::string &name)
	{
		std::vector<std::string> collection;
		{
			std::string tmp;
			for (auto &ch: path) {
				if (ch == cs::path_delimiter) {
					collection.push_back(tmp);
					tmp.clear();
				}
				else
					tmp.push_back(ch);
			}
			collection.push_back(tmp);
		}
		for (auto &it: collection) {
			std::string package_path = it + path_separator + name;
			if (context->compiler->modules.count(package_path) > 0)
				return context->compiler->modules[package_path];
			if (std::ifstream(package_path + ".csp")) {
				context_t rt = create_subcontext(context);
				rt->compiler->import_csym(package_path + ".csp", package_path + ".csym");
				rt->compiler->swap_context(rt);
				try {
					rt->instance->compile(package_path + ".csp");
				}
				catch (...) {
					context->compiler->swap_context(context);
					throw;
				}
				context->compiler->swap_context(context);
				rt->instance->interpret();
				if (rt->package_name.empty())
					throw runtime_error("Target file is not a package.");
				if (rt->package_name != name)
					throw runtime_error("Package name is different from file name.");
				namespace_t module = std::make_shared<name_space>(*rt->instance->storage.get_namespace());
				context->compiler->modules.emplace(package_path, module);
				return module;
			}
			else if (std::ifstream(package_path + ".cse")) {
				namespace_t module = std::make_shared<extension>(package_path + ".cse");
				context->compiler->modules.emplace(package_path, module);
				return module;
			}
		}
		throw fatal_error("No such file or directory.");
	}